

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::
str<kj::String,char_const*,char_const(&)[2],int,char_const(&)[3],kj::Exception::Type,char_const*,kj::StringPtr,char_const*,kj::StringPtr,char_const*,kj::String,kj::String>
          (String *__return_storage_ptr__,kj *this,String *params,char **params_1,
          char (*params_2) [2],int *params_3,char (*params_4) [3],Type *params_5,char **params_6,
          StringPtr *params_7,char **params_8,StringPtr *params_9,char **params_10,String *params_11
          ,String *params_12)

{
  String *pSVar1;
  char **ppcVar2;
  char (*value) [2];
  int *value_00;
  char (*value_01) [3];
  Type *value_02;
  StringPtr *pSVar3;
  String *params_12_00;
  ArrayPtr<const_char> local_138;
  ArrayPtr<const_char> local_128;
  ArrayPtr<const_char> local_118;
  ArrayPtr<const_char> local_108;
  ArrayPtr<const_char> local_f8;
  ArrayPtr<const_char> local_e8;
  ArrayPtr<const_char> local_d8;
  ArrayPtr<const_char> local_c8;
  ArrayPtr<const_char> local_b8;
  CappedArray<char,_14UL> local_a8;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  char (*local_60) [3];
  char (*params_local_4) [3];
  int *params_local_3;
  char (*params_local_2) [2];
  char **params_local_1;
  String *params_local;
  
  params_12_00 = __return_storage_ptr__;
  local_60 = (char (*) [3])params_3;
  params_local_4 = (char (*) [3])params_2;
  params_local_3 = (int *)params_1;
  params_local_2 = (char (*) [2])params;
  params_local_1 = (char **)this;
  params_local = __return_storage_ptr__;
  pSVar1 = fwd<kj::String>((NoInfer<kj::String> *)this);
  local_70 = toCharSequence<kj::String>(pSVar1);
  ppcVar2 = fwd<char_const*>((NoInfer<const_char_*> *)params_local_2);
  local_80 = toCharSequence<char_const*>(ppcVar2);
  value = ::const((char (*) [2])params_local_3);
  local_90 = toCharSequence<char_const(&)[2]>(value);
  value_00 = fwd<int>((NoInfer<int> *)params_local_4);
  toCharSequence<int>(&local_a8,value_00);
  value_01 = ::const(local_60);
  local_b8 = toCharSequence<char_const(&)[3]>(value_01);
  value_02 = fwd<kj::Exception::Type>((NoInfer<kj::Exception::Type> *)params_4);
  local_c8 = (ArrayPtr<const_char>)toCharSequence<kj::Exception::Type>(value_02);
  ppcVar2 = fwd<char_const*>((NoInfer<const_char_*> *)params_5);
  local_d8 = toCharSequence<char_const*>(ppcVar2);
  pSVar3 = fwd<kj::StringPtr>((NoInfer<kj::StringPtr> *)params_6);
  local_e8 = toCharSequence<kj::StringPtr>(pSVar3);
  ppcVar2 = fwd<char_const*>((NoInfer<const_char_*> *)params_7);
  local_f8 = toCharSequence<char_const*>(ppcVar2);
  pSVar3 = fwd<kj::StringPtr>((NoInfer<kj::StringPtr> *)params_8);
  local_108 = toCharSequence<kj::StringPtr>(pSVar3);
  ppcVar2 = fwd<char_const*>((NoInfer<const_char_*> *)params_9);
  local_118 = toCharSequence<char_const*>(ppcVar2);
  pSVar1 = fwd<kj::String>((NoInfer<kj::String> *)params_10);
  local_128 = toCharSequence<kj::String>(pSVar1);
  pSVar1 = fwd<kj::String>(params_11);
  local_138 = toCharSequence<kj::String>(pSVar1);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (params_12_00,(_ *)&local_70,&local_80,&local_90,(ArrayPtr<const_char> *)&local_a8,
             (CappedArray<char,_14UL> *)&local_b8,&local_c8,(StringPtr *)&local_d8,&local_e8,
             &local_f8,&local_108,&local_118,&local_128,&local_138,
             (ArrayPtr<const_char> *)params_12_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}